

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  MessageLite *pMVar1;
  Arena **v1;
  void **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  MessageLite *ret;
  Voidify local_91;
  void *local_90;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LogMessage local_78;
  Voidify local_65 [20];
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  MessageLite *local_38;
  Arena *submessage_arena_local;
  MessageLite *submessage_local;
  Arena *message_arena_local;
  Arena *local_18;
  MessageLite *local_10;
  
  local_38 = (MessageLite *)submessage_arena;
  submessage_arena_local = (Arena *)submessage;
  submessage_local = (MessageLite *)message_arena;
  pMVar1 = (MessageLite *)MessageLite::GetArena(submessage);
  local_51 = 0;
  if (pMVar1 != local_38) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x18d,"submessage->GetArena() == submessage_arena");
    local_51 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  }
  if ((local_51 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  absl_log_internal_check_op_result._7_1_ = 0;
  if (submessage_local == local_38) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x18e,"message_arena != submessage_arena");
    absl_log_internal_check_op_result._7_1_ = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_65,pLVar2);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                 ((Arena **)&local_38);
  local_90 = (void *)0x0;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_90);
  local_88 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                       (v1,v2,"submessage_arena == nullptr");
  if (local_88 == (Nullable<const_char_*>)0x0) {
    if ((submessage_local == (MessageLite *)0x0) || (local_38 != (MessageLite *)0x0)) {
      pMVar1 = MessageLite::New((MessageLite *)submessage_arena_local,(Arena *)submessage_local);
      MessageLite::CheckTypeAndMergeFrom(pMVar1,(MessageLite *)submessage_arena_local);
      message_arena_local = (Arena *)pMVar1;
    }
    else {
      local_10 = submessage_local;
      local_18 = submessage_arena_local;
      if (submessage_arena_local != (Arena *)0x0) {
        ThreadSafeArena::AddCleanup
                  ((ThreadSafeArena *)submessage_local,submessage_arena_local,
                   arena_delete_object<google::protobuf::MessageLite>);
      }
      message_arena_local = submessage_arena_local;
    }
    return (MessageLite *)message_arena_local;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_88);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&ret,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_util.cc"
             ,399,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&ret);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ret);
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  ABSL_DCHECK(submessage->GetArena() == submessage_arena);
  ABSL_DCHECK(message_arena != submessage_arena);
  ABSL_DCHECK_EQ(submessage_arena, nullptr);
  if (message_arena != nullptr && submessage_arena == nullptr) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}